

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::AsyncCapabilityStream::ReadResult> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpFrom::tryReadWithFds
          (BlockedPumpFrom *this,void *readBuffer,size_t minBytes,size_t maxBytes,OwnFd *fdBuffer,
          size_t maxFds)

{
  AsyncOutputStream local_38;
  OwnFd *fdBuffer_local;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *readBuffer_local;
  BlockedPumpFrom *this_local;
  
  local_38._vptr_AsyncOutputStream = (_func_int **)maxFds;
  fdBuffer_local = fdBuffer;
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  readBuffer_local = readBuffer;
  this_local = this;
  tryRead((BlockedPumpFrom *)&stack0xffffffffffffffc0,readBuffer,minBytes,maxBytes);
  Promise<unsigned_long>::
  then<kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::tryReadWithFds(void*,unsigned_long,unsigned_long,kj::OwnFd*,unsigned_long)::_lambda(unsigned_long)_1_>
            ((Promise<unsigned_long> *)this,(Type *)&stack0xffffffffffffffc0);
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&stack0xffffffffffffffc0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<ReadResult> tryReadWithFds(void* readBuffer, size_t minBytes, size_t maxBytes,
                                       OwnFd* fdBuffer, size_t maxFds) override {
      // Pumps drop all capabilities, so fall back to regular read. (We don't even know if the
      // destination is an AsyncCapabilityStream...)
      return tryRead(readBuffer, minBytes, maxBytes)
          .then([](size_t n) { return ReadResult { n, 0 }; });
    }